

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint Kit_DsdGetSupports_rec(Kit_DsdNtk_t *p,int iLit)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  uint uVar3;
  uint uVar4;
  Kit_DsdObj_t *pKVar5;
  ulong uVar6;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)iLit >> 1;
  uVar1 = p->nVars;
  uVar3 = (uint)p->nNodes + (uint)uVar1;
  if (uVar4 < uVar3) {
    if (uVar4 < uVar1) {
      pKVar5 = (Kit_DsdObj_t *)0x0;
    }
    else {
      pKVar5 = p->pNodes[(ulong)uVar4 - (ulong)uVar1];
    }
    if (pKVar5 == (Kit_DsdObj_t *)0x0) {
      if (uVar3 <= uVar4) {
        __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                      ,0x9c,"unsigned int Kit_DsdLitSupport(Kit_DsdNtk_t *, int)");
      }
      if (p->pSupps == (uint *)0x0) {
        uVar3 = 0;
      }
      else if (uVar4 < uVar1) {
        uVar3 = 1 << ((byte)uVar4 & 0x1f);
      }
      else {
        uVar3 = p->pSupps[(ulong)uVar4 - (ulong)uVar1];
      }
    }
    else {
      KVar2 = *pKVar5;
      uVar3 = 0;
      if (0x3ffffff < (uint)KVar2) {
        uVar6 = 0;
        uVar3 = 0;
        do {
          uVar4 = Kit_DsdGetSupports_rec
                            (p,(uint)*(ushort *)((long)&pKVar5[1].field_0x0 + uVar6 * 2));
          uVar3 = uVar3 | uVar4;
          uVar6 = uVar6 + 1;
          KVar2 = *pKVar5;
        } while (uVar6 < (uint)KVar2 >> 0x1a);
      }
      p->pSupps[(ulong)((uint)KVar2 & 0x3f) - (ulong)p->nVars] = uVar3;
      if (0xffff < uVar3) {
        __assert_fail("uSupport <= 0xFFFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                      ,0x6d4,"unsigned int Kit_DsdGetSupports_rec(Kit_DsdNtk_t *, int)");
      }
    }
    return uVar3;
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

unsigned Kit_DsdGetSupports_rec( Kit_DsdNtk_t * p, int iLit )
{
    Kit_DsdObj_t * pObj;
    unsigned uSupport, k;
    int iFaninLit;
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return Kit_DsdLitSupport( p, iLit );
    uSupport = 0;
    Kit_DsdObjForEachFanin( p, pObj, iFaninLit, k )
        uSupport |= Kit_DsdGetSupports_rec( p, iFaninLit );
    p->pSupps[pObj->Id - p->nVars] = uSupport;
    assert( uSupport <= 0xFFFF );
    return uSupport;
}